

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  pointer pcVar1;
  _Any_data _Stack_58;
  code *local_48;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pcVar1 = (typeval->_M_dataplus)._M_p;
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + typeval->_M_string_length);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)_Stack_58._M_pod_data,
             (anon_class_32_1_50816887 *)local_38);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&this->type_name_,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&_Stack_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return this;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }